

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmemmgr.c
# Opt level: O3

void * alloc_large(j_common_ptr cinfo,int pool_id,size_t sizeofobject)

{
  jpeg_memory_mgr *pjVar1;
  jpeg_error_mgr *pjVar2;
  _func_JSAMPARRAY_j_common_ptr_int_JDIMENSION_JDIMENSION *p_Var3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  
  pjVar1 = cinfo->mem;
  if (1000000000 < sizeofobject) {
    *(undefined8 *)&cinfo->err->msg_code = 0x800000036;
    (*cinfo->err->error_exit)(cinfo);
  }
  uVar6 = sizeofobject + 0x1f & 0xffffffffffffffe0;
  uVar4 = uVar6 + 0x37;
  if (1000000000 < uVar4) {
    *(undefined8 *)&cinfo->err->msg_code = 0x300000036;
    (*cinfo->err->error_exit)(cinfo);
  }
  if (1 < (uint)pool_id) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0xe;
    (pjVar2->msg_parm).i[0] = pool_id;
    (*cinfo->err->error_exit)(cinfo);
  }
  p_Var3 = (_func_JSAMPARRAY_j_common_ptr_int_JDIMENSION_JDIMENSION *)jpeg_get_large(cinfo,uVar4);
  if (p_Var3 == (_func_JSAMPARRAY_j_common_ptr_int_JDIMENSION_JDIMENSION *)0x0) {
    *(undefined8 *)&cinfo->err->msg_code = 0x400000036;
    (*cinfo->err->error_exit)(cinfo);
  }
  pjVar1[1].realize_virt_arrays = pjVar1[1].realize_virt_arrays + uVar4;
  *(_func_JSAMPARRAY_j_common_ptr_int_JDIMENSION_JDIMENSION **)p_Var3 =
       (&pjVar1[1].alloc_sarray)[pool_id];
  *(ulong *)(p_Var3 + 8) = uVar6;
  *(undefined8 *)(p_Var3 + 0x10) = 0;
  (&pjVar1[1].alloc_sarray)[pool_id] = p_Var3;
  uVar4 = (ulong)((int)p_Var3 + 0x18U & 0x1f);
  lVar5 = 0x20 - uVar4;
  if (uVar4 == 0) {
    lVar5 = 0;
  }
  return p_Var3 + lVar5 + 0x18;
}

Assistant:

METHODDEF(void *)
alloc_large(j_common_ptr cinfo, int pool_id, size_t sizeofobject)
/* Allocate a "large" object */
{
  my_mem_ptr mem = (my_mem_ptr)cinfo->mem;
  large_pool_ptr hdr_ptr;
  char *data_ptr;

  /*
   * Round up the requested size to a multiple of ALIGN_SIZE so that
   * algorithms can straddle outside the proper area up to the next
   * alignment.
   */
  if (sizeofobject > MAX_ALLOC_CHUNK) {
    /* This prevents overflow/wrap-around in round_up_pow2() if sizeofobject
       is close to SIZE_MAX. */
    out_of_memory(cinfo, 8);
  }
  sizeofobject = round_up_pow2(sizeofobject, ALIGN_SIZE);

  /* Check for unsatisfiable request (do now to ensure no overflow below) */
  if ((sizeof(large_pool_hdr) + sizeofobject + ALIGN_SIZE - 1) >
      MAX_ALLOC_CHUNK)
    out_of_memory(cinfo, 3);    /* request exceeds malloc's ability */

  /* Always make a new pool */
  if (pool_id < 0 || pool_id >= JPOOL_NUMPOOLS)
    ERREXIT1(cinfo, JERR_BAD_POOL_ID, pool_id); /* safety check */

  hdr_ptr = (large_pool_ptr)jpeg_get_large(cinfo, sizeofobject +
                                           sizeof(large_pool_hdr) +
                                           ALIGN_SIZE - 1);
  if (hdr_ptr == NULL)
    out_of_memory(cinfo, 4);    /* jpeg_get_large failed */
  mem->total_space_allocated += sizeofobject + sizeof(large_pool_hdr) +
                                ALIGN_SIZE - 1;

  /* Success, initialize the new pool header and add to list */
  hdr_ptr->next = mem->large_list[pool_id];
  /* We maintain space counts in each pool header for statistical purposes,
   * even though they are not needed for allocation.
   */
  hdr_ptr->bytes_used = sizeofobject;
  hdr_ptr->bytes_left = 0;
  mem->large_list[pool_id] = hdr_ptr;

  data_ptr = (char *)hdr_ptr; /* point to first data byte in pool... */
  data_ptr += sizeof(small_pool_hdr); /* ...by skipping the header... */
  if ((size_t)data_ptr % ALIGN_SIZE) /* ...and adjust for alignment */
    data_ptr += ALIGN_SIZE - (size_t)data_ptr % ALIGN_SIZE;

  return (void *)data_ptr;
}